

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::characterLiteral(TPpContext *this,TPpToken *ppToken)

{
  EShSource EVar1;
  int iVar2;
  bool bVar3;
  int ch;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  ppToken->name[0] = '\0';
  (ppToken->field_3).ival = 0;
  EVar1 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate);
  if (EVar1 == EShSourceHlsl) {
    iVar2 = getChar(this);
    if (iVar2 == 0x27) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"unexpected","\'","");
      this_local._4_4_ = 0x98;
    }
    else {
      if (iVar2 == 0x5c) {
        iVar2 = getChar(this);
        switch(iVar2) {
        case 0x30:
        case 0x78:
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"octal and hex sequences not supported","\\","");
          break;
        default:
          (ppToken->field_3).ival = iVar2;
          break;
        case 0x61:
          (ppToken->field_3).ival = 7;
          break;
        case 0x62:
          (ppToken->field_3).ival = 8;
          break;
        case 0x66:
          (ppToken->field_3).ival = 0xc;
          break;
        case 0x6e:
          (ppToken->field_3).ival = 10;
          break;
        case 0x72:
          (ppToken->field_3).ival = 0xd;
          break;
        case 0x74:
          (ppToken->field_3).ival = 9;
          break;
        case 0x76:
          (ppToken->field_3).ival = 0xb;
        }
      }
      else {
        (ppToken->field_3).ival = iVar2;
      }
      ppToken->name[0] = (char)(ppToken->field_3).ival;
      ppToken->name[1] = '\0';
      iVar2 = getChar(this);
      if (iVar2 != 0x27) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"expected","\'","");
        do {
          iVar2 = getChar(this);
          bVar3 = false;
          if ((iVar2 != 0x27) && (bVar3 = false, iVar2 != -1)) {
            bVar3 = iVar2 != 10;
          }
        } while (bVar3);
      }
      this_local._4_4_ = 0x98;
    }
  }
  else {
    this_local._4_4_ = 0x27;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::characterLiteral(TPpToken* ppToken)
{
    ppToken->name[0] = 0;
    ppToken->ival = 0;

    if (parseContext.intermediate.getSource() != EShSourceHlsl) {
        // illegal, except in macro definition, for which case we report the character
        return '\'';
    }

    int ch = getChar();
    switch (ch) {
    case '\'':
        // As empty sequence:  ''
        parseContext.ppError(ppToken->loc, "unexpected", "\'", "");
        return PpAtomConstInt;
    case '\\':
        // As escape sequence:  '\XXX'
        switch (ch = getChar()) {
        case 'a':
            ppToken->ival = 7;
            break;
        case 'b':
            ppToken->ival = 8;
            break;
        case 't':
            ppToken->ival = 9;
            break;
        case 'n':
            ppToken->ival = 10;
            break;
        case 'v':
            ppToken->ival = 11;
            break;
        case 'f':
            ppToken->ival = 12;
            break;
        case 'r':
            ppToken->ival = 13;
            break;
        case 'x':
        case '0':
            parseContext.ppError(ppToken->loc, "octal and hex sequences not supported", "\\", "");
            break;
        default:
            // This catches '\'', '\"', '\?', etc.
            // Also, things like '\C' mean the same thing as 'C'
            // (after the above cases are filtered out).
            ppToken->ival = ch;
            break;
        }
        break;
    default:
        ppToken->ival = ch;
        break;
    }
    ppToken->name[0] = (char)ppToken->ival;
    ppToken->name[1] = '\0';
    ch = getChar();
    if (ch != '\'') {
        parseContext.ppError(ppToken->loc, "expected", "\'", "");
        // Look ahead for a closing '
        do {
            ch = getChar();
        } while (ch != '\'' && ch != EndOfInput && ch != '\n');
    }

    return PpAtomConstInt;
}